

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

Symbol finish_symop(Env *env,Symbol s)

{
  uint32_t start;
  Symbol SVar1;
  
  if ((env->symbols[s] != false) || (SVar1 = FAIL, env->symbols[0x27] == true)) {
    start = env->symop;
    if (start == 0) {
      start = advance_while(env,0,symop_char);
      env->symop = start;
    }
    SVar1 = left_section_op(env,start);
    if (SVar1 == FAIL) {
      (*env->lexer->mark_end)(env->lexer);
      SVar1 = s;
    }
  }
  return SVar1;
}

Assistant:

static Symbol finish_symop(Env *env, Symbol s) {
  if (valid(env, s) || valid(env, LEFT_SECTION_OP)) {
    uint32_t after_symop = symop_lookahead(env);
    SEQ(left_section_op(env, after_symop));
    MARK("symop");
    return s;
  }
  return FAIL;
}